

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename,uint quality)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  pointer_____offset_0x10___ *ppuVar5;
  char *pcVar6;
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  bVar1 = is_empty(this);
  if (bVar1) {
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgInstanceException::CImgInstanceException
              ((CImgInstanceException *)this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Empty instance, for file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"unsigned char",filename);
    ppuVar5 = &CImgInstanceException::typeinfo;
  }
  else {
    memset(command,0,0x400);
    memset(filetmp,0,0x200);
    while( true ) {
      pcVar2 = cimg::temporary_path((char *)0x0,false);
      pcVar3 = cimg::filenamerand();
      pcVar6 = "ppm";
      if (this->_spectrum == 1) {
        pcVar6 = "pgm";
      }
      snprintf(filetmp,0x200,"%s%c%s.%s",pcVar2,0x2f,pcVar3,pcVar6);
      pFVar4 = fopen(filetmp,"rb");
      if (pFVar4 == (FILE *)0x0) break;
      cimg::fclose(pFVar4);
    }
    save_pnm(this,filetmp,0);
    pcVar2 = cimg::graphicsmagick_path((char *)0x0,false);
    snprintf(command,0x400,"%s -quality %u%% \"%s\" \"%s\"",pcVar2,(ulong)quality,filetmp,filename);
    system(command);
    pFVar4 = fopen(filename,"rb");
    if (pFVar4 != (FILE *)0x0) {
      cimg::fclose(pFVar4);
      remove(filetmp);
      return this;
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Failed to save file \'%s\' with external command \'gm\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"unsigned char",filename);
    ppuVar5 = &CImgIOException::typeinfo;
  }
  __cxa_throw(this_01,ppuVar5,std::exception::~exception);
}

Assistant:

const CImg<T>& save_graphicsmagick_external(const char *const filename, const unsigned int quality=100) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_graphicsmagick_external() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file;
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.%s",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),_spectrum==1?"pgm":"ppm");
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      save_pnm(filetmp);
      cimg_snprintf(command,sizeof(command),"%s -quality %u%% \"%s\" \"%s\"",cimg::graphicsmagick_path(),quality,filetmp,filename);
      cimg::system(command);
      file = std::fopen(filename,"rb");
      if (!file)
        throw CImgIOException(_cimg_instance
                              "save_graphicsmagick_external() : Failed to save file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      if (file) cimg::fclose(file);
      std::remove(filetmp);
      return *this;
    }